

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O3

void __thiscall cursespp::Window::OnParentVisibilityChanged(Window *this,bool visible)

{
  long lVar1;
  _func_int **pp_Var2;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,visible) == 0) {
    if (this->isVisibleInParent == false) {
      return;
    }
    if (this->framePanel == (PANEL *)0x0) {
      return;
    }
    lVar1 = 0x180;
  }
  else {
    if (this->isVisibleInParent == false) {
      return;
    }
    pp_Var2 = (this->super_IWindow).super_IOrderable._vptr_IOrderable;
    if (this->framePanel != (PANEL *)0x0) {
      pp_Var2 = pp_Var2 + 5;
      goto LAB_001842ef;
    }
    (*pp_Var2[0x30])(this);
    lVar1 = 0x178;
  }
  pp_Var2 = (_func_int **)(lVar1 + (long)(this->super_IWindow).super_IOrderable._vptr_IOrderable);
LAB_001842ef:
  (**pp_Var2)(this);
  return;
}

Assistant:

void Window::OnParentVisibilityChanged(bool visible) {
    if (!visible && this->isVisibleInParent) {
        if (this->framePanel) {
            this->Destroy();
        }
    }
    else if (visible && this->isVisibleInParent) {
        if (this->framePanel) {
            this->Redraw();
        }
        else {
            this->Recreate();
        }
    }
}